

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::getCols(Highs *this,HighsInt *mask,HighsInt *num_col,double *costs,double *lower,
              double *upper,HighsInt *num_nz,HighsInt *start,HighsInt *index,double *value)

{
  Highs *in_RCX;
  HighsIndexCollection *in_R8;
  HighsInt *in_R9;
  HighsIndexCollection *in_stack_00000010;
  HighsInt *in_stack_00000018;
  HighsInt *in_stack_00000020;
  double *in_stack_00000028;
  bool create_error;
  HighsIndexCollection index_collection;
  HighsIndexCollection *in_stack_ffffffffffffff30;
  HighsInt in_stack_ffffffffffffff6c;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  HighsIndexCollection *in_stack_ffffffffffffff78;
  double *in_stack_ffffffffffffffb0;
  double *in_stack_ffffffffffffffb8;
  double *in_stack_ffffffffffffffc0;
  
  HighsIndexCollection::HighsIndexCollection(in_stack_ffffffffffffff30);
  create(in_stack_ffffffffffffff78,
         (HighsInt *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
         in_stack_ffffffffffffff6c);
  getColsInterface(in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                   in_stack_ffffffffffffffb0,&in_stack_00000010->dimension_,in_stack_00000018,
                   in_stack_00000020,in_stack_00000028);
  HighsIndexCollection::~HighsIndexCollection(in_stack_00000010);
  return kOk;
}

Assistant:

HighsStatus Highs::getCols(const HighsInt* mask, HighsInt& num_col,
                           double* costs, double* lower, double* upper,
                           HighsInt& num_nz, HighsInt* start, HighsInt* index,
                           double* value) const {
  HighsIndexCollection index_collection;
  const bool create_error = create(index_collection, mask, model_.lp_.num_col_);
  assert(!create_error);
  (void)create_error;
  getColsInterface(index_collection, num_col, costs, lower, upper, num_nz,
                   start, index, value);
  return HighsStatus::kOk;
}